

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufstream.c
# Opt level: O0

err_t BufRead(bufstream *p,uint8_t *Data,size_t Size,size_t *Readed)

{
  err_t eVar1;
  ulong local_48;
  size_t Left;
  size_t Pos;
  err_t Err;
  size_t *Readed_local;
  size_t Size_local;
  uint8_t *Data_local;
  bufstream *p_local;
  
  Pos = 0;
  Left = 0;
  Err = (err_t)Readed;
  Readed_local = (size_t *)Size;
  Size_local = (size_t)Data;
  Data_local = (uint8_t *)p;
  while (local_48 = (long)Readed_local - Left, local_48 != 0) {
    if (*(ulong *)(Data_local + 0x130) <= *(ulong *)(Data_local + 0x128)) {
      if (0x1000 < local_48) {
        if (*(long *)(Data_local + 0x120) == 0) {
          __assert_fail("(const void*)(p->Stream)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/bufstream.c"
                        ,0x41,"err_t BufRead(bufstream *, uint8_t *, size_t, size_t *)");
        }
        eVar1 = (**(code **)(*(long *)(*(long *)(Data_local + 0x120) + 8) + 0x58))
                          (*(undefined8 *)(Data_local + 0x120),Size_local + Left,local_48,&local_48)
        ;
        if (Err == 0) {
          return eVar1;
        }
        *(size_t *)Err = Left + local_48;
        return eVar1;
      }
      Data_local[0x128] = '\0';
      Data_local[0x129] = '\0';
      Data_local[0x12a] = '\0';
      Data_local[299] = '\0';
      Data_local[300] = '\0';
      Data_local[0x12d] = '\0';
      Data_local[0x12e] = '\0';
      Data_local[0x12f] = '\0';
      if (*(long *)(Data_local + 0x120) == 0) {
        __assert_fail("(const void*)(p->Stream)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/bufstream.c"
                      ,0x48,"err_t BufRead(bufstream *, uint8_t *, size_t, size_t *)");
      }
      Pos = (**(code **)(*(long *)(*(long *)(Data_local + 0x120) + 8) + 0x58))
                      (*(undefined8 *)(Data_local + 0x120),Data_local + 0x140,0x1000,
                       Data_local + 0x130);
      if (*(long *)(Data_local + 0x130) == 0) break;
    }
    if ((ulong)(*(long *)(Data_local + 0x130) - *(long *)(Data_local + 0x128)) < local_48) {
      local_48 = *(long *)(Data_local + 0x130) - *(long *)(Data_local + 0x128);
    }
    memcpy((void *)(Size_local + Left),Data_local + *(long *)(Data_local + 0x128) + 0x140,local_48);
    Left = local_48 + Left;
    *(ulong *)(Data_local + 0x128) = local_48 + *(long *)(Data_local + 0x128);
  }
  if (Err != 0) {
    *(size_t *)Err = Left;
  }
  if (Readed_local <= Left) {
    Pos = 0;
  }
  return Pos;
}

Assistant:

static err_t BufRead(bufstream* p,uint8_t* Data,size_t Size,size_t* Readed)
{
    err_t Err = ERR_NONE;
    size_t Pos = 0;
    size_t Left;

    while ((Left = (Size - Pos)) > 0)
    {
        if (p->ReadSize <= p->ReadPos)
        {
            if (Left > BUFSTREAM_SIZE)
            {
                Err = Stream_Read(p->Stream,Data+Pos,Left,&Left);
                if (Readed)
                    *Readed = Pos+Left;
                return Err;
            }

            p->ReadPos = 0;
            Err = Stream_Read(p->Stream,p->Buffer,BUFSTREAM_SIZE,&p->ReadSize);
            if (p->ReadSize <= 0)
                break;
        }

        if (Left > p->ReadSize - p->ReadPos)
            Left = p->ReadSize - p->ReadPos;

        memcpy(Data+Pos,p->Buffer+p->ReadPos,Left);
        Pos += Left;
        p->ReadPos += Left;
    }

    if (Readed)
        *Readed = Pos;

    if (Pos >= Size)
        Err = ERR_NONE; //override possible end of file in later of the buffer
    return Err;
}